

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

int Imf_3_2::anon_unknown_8::floorLog2(int x)

{
  int y;
  int x_local;
  
  y = 0;
  for (x_local = x; 1 < x_local; x_local = x_local >> 1) {
    y = y + 1;
  }
  return y;
}

Assistant:

int
floorLog2 (int x)
{
    //
    // For x > 0, floorLog2(y) returns floor(log(x)/log(2)).
    //

    int y = 0;

    while (x > 1)
    {
        y += 1;
        x >>= 1;
    }

    return y;
}